

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StyleSheet.cpp
# Opt level: O0

DecoratorPtrList * __thiscall
Rml::StyleSheet::InstanceDecorators
          (StyleSheet *this,RenderManager *render_manager,DecoratorDeclarationList *declaration_list
          ,PropertySource *source)

{
  _func_int **pp_Var1;
  DecoratorInstancer *pDVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  pointer ppVar8;
  size_type __n;
  undefined8 uVar9;
  undefined8 uVar10;
  pointer ppVar11;
  pointer ppVar12;
  iterator iVar13;
  const_iterator cVar14;
  uint local_254;
  char *local_248;
  uint local_1e4;
  char *local_1d8;
  StyleSheet *local_1a0;
  shared_ptr<const_Rml::Decorator> local_150;
  DecoratorInstancerInterface local_140;
  shared_ptr<Rml::Decorator> local_128;
  const_iterator local_118;
  undefined1 local_108 [8];
  const_iterator it_map;
  shared_ptr<Rml::Decorator> local_e0;
  undefined1 local_d0 [8];
  SharedPtr<Decorator> decorator;
  DecoratorDeclaration *declaration;
  const_iterator __end1;
  const_iterator __begin1;
  Vector<DecoratorDeclaration> *__range1;
  DecoratorPtrList *decorators;
  iterator local_90;
  undefined1 local_80 [8];
  iterator it_cache;
  undefined1 local_60 [8];
  String key;
  bool enable_cache;
  RmlUiAssertNonrecursive rmlui_nonrecursive;
  PropertySource *source_local;
  DecoratorDeclarationList *declaration_list_local;
  RenderManager *render_manager_local;
  StyleSheet *this_local;
  
  rmlui_nonrecursive.entered = (bool *)source;
  RmlUiAssertNonrecursive::RmlUiAssertNonrecursive
            ((RmlUiAssertNonrecursive *)&stack0xffffffffffffffc8,
             &InstanceDecorators::rmlui_nonrecursive_entered);
  if ((InstanceDecorators(Rml::RenderManager&,Rml::DecoratorDeclarationList_const&,Rml::PropertySource_const*)
       ::non_cached_decorator_list == '\0') &&
     (iVar7 = __cxa_guard_acquire(&InstanceDecorators(Rml::RenderManager&,Rml::DecoratorDeclarationList_const&,Rml::PropertySource_const*)
                                   ::non_cached_decorator_list), iVar7 != 0)) {
    ::std::
    vector<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
    ::vector(&InstanceDecorators::non_cached_decorator_list);
    __cxa_atexit(::std::
                 vector<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
                 ::~vector,&InstanceDecorators::non_cached_decorator_list,&__dso_handle);
    __cxa_guard_release(&InstanceDecorators(Rml::RenderManager&,Rml::DecoratorDeclarationList_const&,Rml::PropertySource_const*)
                         ::non_cached_decorator_list);
  }
  bVar5 = ::std::__cxx11::string::empty();
  key.field_2._M_local_buf[0xf] = (bVar5 ^ 0xff) & 1;
  ::std::__cxx11::string::string((string *)local_60);
  if ((key.field_2._M_local_buf[0xf] & 1U) == 0) {
    ::std::
    vector<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
    ::clear(&InstanceDecorators::non_cached_decorator_list);
  }
  else {
    ::std::__cxx11::string::size();
    if (rmlui_nonrecursive.entered != (bool *)0x0) {
      ::std::__cxx11::string::size();
    }
    ::std::__cxx11::string::reserve((ulong)local_60);
    ::std::__cxx11::string::operator=((string *)local_60,(string *)&declaration_list->value);
    ::std::__cxx11::string::operator+=((string *)local_60,';');
    if (rmlui_nonrecursive.entered != (bool *)0x0) {
      ::std::__cxx11::string::operator+=((string *)local_60,(string *)rmlui_nonrecursive.entered);
    }
    iVar13 = robin_hood::detail::
             Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&this->decorator_cache,(key_type *)local_60);
    it_cache.mKeyVals = (NodePtr)iVar13.mInfo;
    local_80 = (undefined1  [8])iVar13.mKeyVals;
    local_90 = robin_hood::detail::
               Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&this->decorator_cache);
    bVar6 = robin_hood::detail::
            Table<true,80ul,std::__cxx11::string,std::vector<std::shared_ptr<Rml::Decorator_const>,std::allocator<std::shared_ptr<Rml::Decorator_const>>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
            ::Iter<false>::operator!=((Iter<false> *)local_80,&local_90);
    if (bVar6) {
      ppVar8 = robin_hood::detail::
               Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::Iter<false>::operator->((Iter<false> *)local_80);
      this_local = (StyleSheet *)&ppVar8->second;
      goto LAB_006184fc;
    }
  }
  if ((key.field_2._M_local_buf[0xf] & 1U) == 0) {
    local_1a0 = (StyleSheet *)&InstanceDecorators::non_cached_decorator_list;
  }
  else {
    local_1a0 = (StyleSheet *)
                robin_hood::detail::
                Table<true,80ul,std::__cxx11::string,std::vector<std::shared_ptr<Rml::Decorator_const>,std::allocator<std::shared_ptr<Rml::Decorator_const>>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                ::
                operator[]<std::vector<std::shared_ptr<Rml::Decorator_const>,std::allocator<std::shared_ptr<Rml::Decorator_const>>>>
                          ((Table<true,80ul,std::__cxx11::string,std::vector<std::shared_ptr<Rml::Decorator_const>,std::allocator<std::shared_ptr<Rml::Decorator_const>>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                            *)&this->decorator_cache,(key_type *)local_60);
  }
  __n = ::std::vector<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>::size
                  (&declaration_list->list);
  ::std::
  vector<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
  ::reserve((vector<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
             *)local_1a0,__n);
  __end1 = ::std::vector<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>::
           begin(&declaration_list->list);
  declaration = (DecoratorDeclaration *)
                ::std::vector<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
                ::end(&declaration_list->list);
  while( true ) {
    bVar6 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Rml::DecoratorDeclaration_*,_std::vector<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>_>
                                *)&declaration);
    if (!bVar6) break;
    decorator.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         __gnu_cxx::
         __normal_iterator<const_Rml::DecoratorDeclaration_*,_std::vector<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>_>
         ::operator*(&__end1);
    ::std::shared_ptr<Rml::Decorator>::shared_ptr((shared_ptr<Rml::Decorator> *)local_d0);
    _Var4._M_pi = decorator.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (decorator.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        [2]._vptr__Sp_counted_base == (_func_int **)0x0) {
      cVar14 = robin_hood::detail::
               Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&this->named_decorator_map,
                      (key_type *)
                      decorator.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi);
      it_map.mKeyVals = (NodePtr)cVar14.mInfo;
      local_108 = (undefined1  [8])cVar14.mKeyVals;
      cVar14 = robin_hood::detail::
               Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&this->named_decorator_map);
      local_118 = cVar14;
      bVar6 = robin_hood::detail::
              Table<true,80ul,std::__cxx11::string,Rml::NamedDecorator,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
              ::Iter<true>::operator!=((Iter<true> *)local_108,&local_118);
      if (bVar6) {
        ppVar11 = robin_hood::detail::
                  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::Iter<true>::operator->((Iter<true> *)local_108);
        pDVar2 = (ppVar11->second).instancer;
        ppVar11 = robin_hood::detail::
                  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::Iter<true>::operator->((Iter<true> *)local_108);
        ppVar12 = robin_hood::detail::
                  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::Iter<true>::operator->((Iter<true> *)local_108);
        DecoratorInstancerInterface::DecoratorInstancerInterface
                  (&local_140,render_manager,this,(PropertySource *)rmlui_nonrecursive.entered);
        (*pDVar2->_vptr_DecoratorInstancer[2])
                  (&local_128,pDVar2,&ppVar11->second,&(ppVar12->second).properties,&local_140);
        ::std::shared_ptr<Rml::Decorator>::operator=
                  ((shared_ptr<Rml::Decorator> *)local_d0,&local_128);
        ::std::shared_ptr<Rml::Decorator>::~shared_ptr(&local_128);
      }
      bVar6 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_d0);
      if (!bVar6) {
        uVar9 = ::std::__cxx11::string::c_str();
        if (rmlui_nonrecursive.entered == (bool *)0x0) {
          local_248 = "";
        }
        else {
          local_248 = (char *)::std::__cxx11::string::c_str();
        }
        if (rmlui_nonrecursive.entered == (bool *)0x0) {
          local_254 = 0xffffffff;
        }
        else {
          local_254 = *(uint *)(rmlui_nonrecursive.entered + 0x20);
        }
        Log::Message(LT_WARNING,
                     "Decorator name \'%s\' could not be found in any @decorator rule, declared at %s:%d"
                     ,uVar9,local_248,(ulong)local_254);
      }
    }
    else {
      pp_Var1 = decorator.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi[2]._vptr__Sp_counted_base;
      p_Var3 = decorator.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi + 2;
      DecoratorInstancerInterface::DecoratorInstancerInterface
                ((DecoratorInstancerInterface *)&it_map.mInfo,render_manager,this,
                 (PropertySource *)rmlui_nonrecursive.entered);
      (**(code **)(*pp_Var1 + 0x10))
                (&local_e0,pp_Var1,_Var4._M_pi,&p_Var3->_M_use_count,&it_map.mInfo);
      ::std::shared_ptr<Rml::Decorator>::operator=((shared_ptr<Rml::Decorator> *)local_d0,&local_e0)
      ;
      ::std::shared_ptr<Rml::Decorator>::~shared_ptr(&local_e0);
      bVar6 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_d0);
      if (!bVar6) {
        uVar9 = ::std::__cxx11::string::c_str();
        uVar10 = ::std::__cxx11::string::c_str();
        if (rmlui_nonrecursive.entered == (bool *)0x0) {
          local_1d8 = "";
        }
        else {
          local_1d8 = (char *)::std::__cxx11::string::c_str();
        }
        if (rmlui_nonrecursive.entered == (bool *)0x0) {
          local_1e4 = 0xffffffff;
        }
        else {
          local_1e4 = *(uint *)(rmlui_nonrecursive.entered + 0x20);
        }
        Log::Message(LT_WARNING,
                     "Decorator \'%s\' in \'%s\' could not be instanced, declared at %s:%d",uVar9,
                     uVar10,local_1d8,(ulong)local_1e4);
      }
    }
    bVar6 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_d0);
    if (bVar6) {
      ::std::shared_ptr<Rml::Decorator_const>::shared_ptr<Rml::Decorator,void>
                ((shared_ptr<Rml::Decorator_const> *)&local_150,
                 (shared_ptr<Rml::Decorator> *)local_d0);
      ::std::
      vector<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
      ::push_back((vector<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
                   *)local_1a0,(value_type *)&local_150);
      ::std::shared_ptr<const_Rml::Decorator>::~shared_ptr(&local_150);
    }
    else {
      ::std::
      vector<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
      ::clear((vector<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
               *)local_1a0);
    }
    ::std::shared_ptr<Rml::Decorator>::~shared_ptr((shared_ptr<Rml::Decorator> *)local_d0);
    if (!bVar6) break;
    __gnu_cxx::
    __normal_iterator<const_Rml::DecoratorDeclaration_*,_std::vector<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>_>
    ::operator++(&__end1);
  }
  this_local = local_1a0;
LAB_006184fc:
  ::std::__cxx11::string::~string((string *)local_60);
  RmlUiAssertNonrecursive::~RmlUiAssertNonrecursive
            ((RmlUiAssertNonrecursive *)&stack0xffffffffffffffc8);
  return (DecoratorPtrList *)this_local;
}

Assistant:

const DecoratorPtrList& StyleSheet::InstanceDecorators(RenderManager& render_manager, const DecoratorDeclarationList& declaration_list,
	const PropertySource* source) const
{
	RMLUI_ASSERT_NONRECURSIVE; // Since we may return a reference to the below static variable.
	static DecoratorPtrList non_cached_decorator_list;

	// Empty declaration values are used for interpolated values which we don't want to cache.
	const bool enable_cache = !declaration_list.value.empty();

	// Generate the cache key. Relative paths of textures may be affected by the source path, and ultimately
	// which texture should be displayed. Thus, we need to include this path in the cache key.
	String key;

	if (enable_cache)
	{
		key.reserve(declaration_list.value.size() + 1 + (source ? source->path.size() : 0));
		key = declaration_list.value;
		key += ';';
		if (source)
			key += source->path;

		auto it_cache = decorator_cache.find(key);
		if (it_cache != decorator_cache.end())
			return it_cache->second;
	}
	else
	{
		non_cached_decorator_list.clear();
	}

	DecoratorPtrList& decorators = enable_cache ? decorator_cache[key] : non_cached_decorator_list;
	decorators.reserve(declaration_list.list.size());

	for (const DecoratorDeclaration& declaration : declaration_list.list)
	{
		SharedPtr<Decorator> decorator;

		if (declaration.instancer)
		{
			RMLUI_ZoneScopedN("InstanceDecorator");
			decorator = declaration.instancer->InstanceDecorator(declaration.type, declaration.properties,
				DecoratorInstancerInterface(render_manager, *this, source));

			if (!decorator)
				Log::Message(Log::LT_WARNING, "Decorator '%s' in '%s' could not be instanced, declared at %s:%d", declaration.type.c_str(),
					declaration_list.value.c_str(), source ? source->path.c_str() : "", source ? source->line_number : -1);
		}
		else
		{
			// If we have no instancer, this means the type is the name of an @decorator rule.
			auto it_map = named_decorator_map.find(declaration.type);
			if (it_map != named_decorator_map.end())
				decorator = it_map->second.instancer->InstanceDecorator(it_map->second.type, it_map->second.properties,
					DecoratorInstancerInterface(render_manager, *this, source));

			if (!decorator)
				Log::Message(Log::LT_WARNING, "Decorator name '%s' could not be found in any @decorator rule, declared at %s:%d",
					declaration.type.c_str(), source ? source->path.c_str() : "", source ? source->line_number : -1);
		}

		if (!decorator)
		{
			decorators.clear();
			break;
		}

		decorators.push_back(std::move(decorator));
	}

	return decorators;
}